

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::StreamRedirect::~StreamRedirect(StreamRedirect *this)

{
  undefined1 *local_38;
  undefined1 local_28 [16];
  
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_append((char *)this->m_targetString,(ulong)local_38);
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  std::ios::rdbuf((streambuf *)(this->m_stream + *(long *)(*(long *)this->m_stream + -0x18)));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->m_oss);
  std::ios_base::~ios_base((ios_base *)&this->field_0x80);
  return;
}

Assistant:

~StreamRedirect() {
			m_targetString += m_oss.str();
			m_stream.rdbuf(m_prevBuf);
		}